

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcSocket.cpp
# Opt level: O0

bool XmlRpc::XmlRpcSocket::nbRead(int fd,string *s,bool *eof)

{
  bool bVar1;
  int iVar2;
  ssize_t sVar3;
  byte *in_RDX;
  char *in_RSI;
  int in_EDI;
  double __x;
  int n;
  bool wouldBlock;
  char readBuf [4096];
  int READ_SIZE;
  byte local_1031;
  undefined1 local_1028 [4108];
  undefined4 local_1c;
  byte *local_18;
  char *local_10;
  int local_8;
  
  local_1c = 0x1000;
  bVar1 = false;
  *in_RDX = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while( true ) {
    local_1031 = 0;
    if (!bVar1) {
      local_1031 = *local_18 ^ 0xff;
    }
    if ((local_1031 & 1) == 0) break;
    sVar3 = read(local_8,local_1028,0xfff);
    iVar2 = (int)sVar3;
    XmlRpcUtil::log(__x);
    if (iVar2 < 1) {
      if (iVar2 == 0) {
        *local_18 = 1;
      }
      else {
        bVar1 = nonFatalError();
        if (!bVar1) {
          return false;
        }
        bVar1 = true;
      }
    }
    else {
      local_1028[iVar2] = 0;
      std::__cxx11::string::append(local_10,(ulong)local_1028);
    }
  }
  return true;
}

Assistant:

bool XmlRpcSocket::nbRead(int fd, std::string& s, bool *eof)
{
  const int READ_SIZE = 4096;   // Number of bytes to attempt to read at a time
  char readBuf[READ_SIZE];

  bool wouldBlock = false;
  *eof = false;

  while ( ! wouldBlock && ! *eof) {
#if defined(_WIN32)
    int n = recv(fd, readBuf, READ_SIZE-1, 0);
#else
    int n = read(fd, readBuf, READ_SIZE-1);
#endif
    XmlRpcUtil::log(5, "XmlRpcSocket::nbRead: read/recv returned %d.", n);

    if (n > 0) {
      readBuf[n] = 0;
      s.append(readBuf, n);
    } else if (n == 0) {
      *eof = true;
    } else if (nonFatalError()) {
      wouldBlock = true;
    } else {
      return false;   // Error
    }
  }
  return true;
}